

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::RegisterFileLevelMetadata(DescriptorTable *table)

{
  AssignDescriptors((DescriptorTable *)0x3631ae);
  RegisterAllTypesInternal(table->file_level_metadata,table->num_messages);
  return;
}

Assistant:

void RegisterFileLevelMetadata(const DescriptorTable* table) {
  AssignDescriptors(table);
  RegisterAllTypesInternal(table->file_level_metadata, table->num_messages);
}